

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  i64 iVar4;
  byte *z;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  
  if ((argv[1]->type != '\x05') && ((argc != 3 || (argv[2]->type != '\x05')))) {
    uVar1 = (*argv)->type;
    iVar4 = sqlite3VdbeIntValue(argv[1]);
    iVar13 = (int)iVar4;
    if (uVar1 == '\x04') {
      iVar2 = sqlite3_value_bytes(*argv);
      z = (byte *)sqlite3_value_blob(*argv);
      if (z != (byte *)0x0) {
LAB_00181fd9:
        if (argc == 3) {
          iVar4 = sqlite3VdbeIntValue(argv[2]);
          iVar3 = (int)iVar4;
          bVar14 = -1 < iVar3;
          lVar5 = -(long)iVar3;
          if (bVar14) {
            lVar5 = (long)iVar3;
          }
        }
        else {
          bVar14 = true;
          lVar5 = (long)((context->s).db)->aLimit[0];
        }
        lVar8 = (long)iVar2;
        if (iVar13 < 0) {
          lVar11 = iVar13 + lVar8;
          if (lVar11 < 0) {
            lVar5 = lVar5 + lVar11;
            lVar11 = 0;
            if (lVar5 < 1) {
              lVar5 = lVar11;
            }
          }
        }
        else if (iVar13 == 0) {
          lVar11 = 0;
          lVar5 = lVar5 - (ulong)(0 < lVar5);
        }
        else {
          lVar11 = (long)iVar13 + -1;
        }
        lVar9 = lVar11 - lVar5;
        lVar12 = 0;
        if (0 < lVar9) {
          lVar12 = lVar9;
        }
        lVar10 = lVar5;
        if (lVar9 < 0) {
          lVar10 = lVar11;
        }
        if (bVar14) {
          lVar10 = lVar5;
          lVar12 = lVar11;
        }
        if (uVar1 != '\x04') {
          while( true ) {
            bVar7 = *z;
            bVar14 = lVar12 == 0;
            lVar12 = lVar12 + -1;
            pbVar6 = z;
            if ((bVar7 == 0) || (bVar14)) break;
            if (bVar7 < 0xc0) {
              z = z + 1;
            }
            else {
              z = z + 1;
            }
          }
          while( true ) {
            bVar14 = lVar10 == 0;
            lVar10 = lVar10 + -1;
            if ((bVar7 == 0) || (bVar14)) break;
            if (bVar7 < 0xc0) {
              bVar7 = pbVar6[1];
              pbVar6 = pbVar6 + 1;
            }
            else {
              bVar7 = pbVar6[1];
              pbVar6 = pbVar6 + 1;
            }
          }
          sqlite3_result_text(context,(char *)z,(int)pbVar6 - (int)z,
                              (_func_void_void_ptr *)0xffffffffffffffff);
          return;
        }
        lVar5 = 0;
        if (0 < lVar8 - lVar12) {
          lVar5 = lVar8 - lVar12;
        }
        if (lVar8 < lVar10 + lVar12) {
          lVar10 = lVar5;
        }
        sqlite3_result_blob(context,z + lVar12,(int)lVar10,(_func_void_void_ptr *)0xffffffffffffffff
                           );
        return;
      }
    }
    else {
      z = sqlite3_value_text(*argv);
      if (z != (byte *)0x0) {
        iVar2 = 0;
        if (iVar13 < 0) {
          iVar2 = 0;
          for (pbVar6 = z; *pbVar6 != 0; pbVar6 = pbVar6 + 1) {
            iVar2 = iVar2 + 1;
          }
        }
        goto LAB_00181fd9;
      }
    }
  }
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;
  int negP2 = 0;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
  if( argc==3 ){
    p2 = sqlite3_value_int(argv[2]);
    if( p2<0 ){
      p2 = -p2;
      negP2 = 1;
    }
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      p2 += p1;
      if( p2<0 ) p2 = 0;
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( negP2 ){
    p1 -= p2;
    if( p1<0 ){
      p2 += p1;
      p1 = 0;
    }
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text(context, (char*)z, (int)(z2-z), SQLITE_TRANSIENT);
  }else{
    if( p1+p2>len ){
      p2 = len-p1;
      if( p2<0 ) p2 = 0;
    }
    sqlite3_result_blob(context, (char*)&z[p1], (int)p2, SQLITE_TRANSIENT);
  }
}